

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,pybind11::str&>(pybind11 *this,str *args_)

{
  PyObject *pPVar1;
  handle hVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  array<pybind11::object,_1UL> args;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  argtypes;
  handle local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pPVar1 = (args_->super_object).super_handle.m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  local_88.m_ptr = (args_->super_object).super_handle.m_ptr;
  if (local_88.m_ptr != (PyObject *)0x0) {
    tuple::tuple((tuple *)this,1);
    hVar2.m_ptr = local_88.m_ptr;
    local_88.m_ptr = (PyObject *)0x0;
    if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) != 0) {
      *(PyObject **)(*(long *)this + 0x18) = hVar2.m_ptr;
      object::~object((object *)&local_88);
      return (object)(object)this;
    }
    __assert_fail("PyTuple_Check(result.ptr())",
                  "/workspace/llm4binary/github/license_c_cmakelists/yijiangh[P]ikfast_pybind/ext/pybind11/include/pybind11/cast.h"
                  ,0x3d9,
                  "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <pybind11::str &>]"
                 );
  }
  type_id<pybind11::str&>();
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"make_tuple(): unable to convert argument of type \'",&local_40);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_80 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_80 == plVar4) {
    local_70 = *plVar4;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar4;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_80);
  *(undefined ***)this_00 = &PTR__runtime_error_0013eb58;
  __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}